

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

VARIABLE_FLAVOUR
gl4cts::GLSL420Pack::Utils::getVariableFlavour
          (SHADER_STAGES stage,VARIABLE_STORAGE storage,qualifierSet *qualifiers)

{
  bool bVar1;
  VARIABLE_FLAVOUR VVar2;
  TestError *this;
  
  VVar2 = BASIC;
  if (storage != UNIFORM) {
    switch(stage) {
    case VERTEX_SHADER:
    case FRAGMENT_SHADER:
      break;
    case TESS_CTRL_SHADER:
      bVar1 = doesContainQualifier(QUAL_PATCH,qualifiers);
      VVar2 = INDEXED_BY_INVOCATION_ID;
      if (storage == OUTPUT) {
        VVar2 = (uint)!bVar1 * 2;
      }
      break;
    case TESS_EVAL_SHADER:
      bVar1 = doesContainQualifier(QUAL_PATCH,qualifiers);
      VVar2 = (uint)(storage == INPUT && !bVar1);
      break;
    case GEOMETRY_SHADER:
      VVar2 = (uint)(storage == INPUT);
      break;
    default:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x473);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return VVar2;
}

Assistant:

Utils::VARIABLE_FLAVOUR Utils::getVariableFlavour(SHADER_STAGES stage, VARIABLE_STORAGE storage,
												  const qualifierSet& qualifiers)
{
	VARIABLE_FLAVOUR result;

	if (UNIFORM == storage)
	{
		result = BASIC;
	}
	else
	{
		switch (stage)
		{
		case Utils::GEOMETRY_SHADER:
			if (Utils::INPUT == storage)
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_EVAL_SHADER:
			if ((false == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::INPUT == storage))
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_CTRL_SHADER:
			if ((true == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::OUTPUT == storage))
			{
				result = BASIC;
			}
			else
			{
				result = INDEXED_BY_INVOCATION_ID;
			}
			break;
		case Utils::VERTEX_SHADER:
		case Utils::FRAGMENT_SHADER:
			result = BASIC;
			break;
		default:
			TCU_FAIL("Invliad enum");
			break;
		}
	}

	return result;
}